

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

void __thiscall expression::expression(expression *this)

{
  _Rb_tree_header *p_Var1;
  
  this->FLAGS = 0;
  this->uuid = 0;
  p_Var1 = &(this->contents)._M_t._M_impl.super__Rb_tree_header;
  (this->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

expression::expression() {}